

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
operator[](InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
           *this,size_type i)

{
  ulong uVar1;
  ValueTypeBuffer VVar2;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if (i < uVar1 >> 1) {
    if ((uVar1 & 1) == 0) {
      VVar2 = (ValueTypeBuffer)&this->rep_;
    }
    else {
      VVar2 = (this->rep_).inlined_storage.inlined[1];
    }
    return (reference)((long)VVar2 + i * 8);
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0xf1,
                "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::operator[](size_type) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>]"
               );
}

Assistant:

size_type size() const { return size_ / 2; }